

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverADMM.cpp
# Opt level: O3

void __thiscall chrono::ChSolverADMM::ArchiveOUT(ChSolverADMM *this)

{
  ChArchiveOut *in_RSI;
  
  ArchiveOUT((ChSolverADMM *)&this[-1].acceleration,in_RSI);
  return;
}

Assistant:

void ChSolverADMM::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChSolverADMM>();
    // serialize parent class
    ChIterativeSolverVI::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(precond);
    marchive << CHNVP(rho);
    marchive << CHNVP(rho_b);
    marchive << CHNVP(sigma);
    marchive << CHNVP(stepadjust_each);
    marchive << CHNVP(stepadjust_threshold);
    marchive << CHNVP(stepadjust_maxfactor);
    marchive << CHNVP(tol_prim);
    marchive << CHNVP(tol_dual);
    my_enum_mappers::AdmmStepType_mapper mmapper;
    marchive << CHNVP(mmapper(this->stepadjust_type), "stepadjust_type");
}